

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O2

void __thiscall tst_InsertProxyModel::testProperties(tst_InsertProxyModel *this)

{
  bool bVar1;
  char cVar2;
  undefined1 uVar3;
  ModelTest *this_00;
  QFlags<InsertProxyModel::InsertDirection> *value;
  undefined1 local_54 [40];
  QFlags<InsertProxyModel::InsertDirection> local_2c;
  InsertProxyModel proxyModel;
  
  InsertProxyModel::InsertProxyModel(&proxyModel,(QObject *)0x0);
  this_00 = (ModelTest *)operator_new(0x10);
  ModelTest::ModelTest(this_00,(QAbstractItemModel *)&proxyModel,&this->super_QObject);
  local_54._0_4_ = 3;
  QVariant::fromValue<QFlags<InsertProxyModel::InsertDirection>>
            ((enable_if_t<std::is_copy_constructible_v<QFlags<InsertProxyModel::InsertDirection>_>,_QVariant>
              *)(local_54 + 4),(QVariant *)local_54,value);
  bVar1 = (bool)QObject::setProperty((char *)&proxyModel,(QVariant *)"insertDirection");
  cVar2 = QTest::qVerify(bVar1,
                         "proxyModel.setProperty(\"insertDirection\", QVariant::fromValue(InsertProxyModel::InsertColumn | InsertProxyModel::InsertRow))"
                         ,"",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                         ,499);
  QVariant::~QVariant((QVariant *)(local_54 + 4));
  if (cVar2 != '\0') {
    QObject::property(local_54 + 4);
    local_54._0_4_ =
         qvariant_cast<QFlags<InsertProxyModel::InsertDirection>>((QVariant *)(local_54 + 4));
    local_2c.i = 3;
    bVar1 = QTest::
            qCompare<QFlags<InsertProxyModel::InsertDirection>,QFlags<InsertProxyModel::InsertDirection>>
                      ((QFlags<InsertProxyModel::InsertDirection> *)local_54,&local_2c,
                       "proxyModel.property(\"insertDirection\").value<InsertProxyModel::InsertDirections>()"
                       ,"InsertProxyModel::InsertColumn | InsertProxyModel::InsertRow",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                       ,0x1f5);
    QVariant::~QVariant((QVariant *)(local_54 + 4));
    if (bVar1) {
      QVariant::QVariant((QVariant *)(local_54 + 4),false);
      bVar1 = (bool)QObject::setProperty((char *)&proxyModel,(QVariant *)"mergeDisplayEdit");
      cVar2 = QTest::qVerify(bVar1,"proxyModel.setProperty(\"mergeDisplayEdit\", false)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                             ,0x1f6);
      QVariant::~QVariant((QVariant *)(local_54 + 4));
      if (cVar2 != '\0') {
        QObject::property(local_54 + 4);
        uVar3 = QVariant::toBool();
        local_54[0] = uVar3;
        local_2c.i = local_2c.i & 0xffffff00;
        QTest::qCompare<bool,bool>
                  ((bool *)local_54,(bool *)&local_2c,
                   "proxyModel.property(\"mergeDisplayEdit\").toBool()","false",
                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                   ,0x1f7);
        QVariant::~QVariant((QVariant *)(local_54 + 4));
      }
    }
  }
  InsertProxyModel::~InsertProxyModel(&proxyModel);
  return;
}

Assistant:

void tst_InsertProxyModel::testProperties()
{
    InsertProxyModel proxyModel;
    new ModelTest(&proxyModel, this);
    QVERIFY(proxyModel.setProperty("insertDirection", QVariant::fromValue(InsertProxyModel::InsertColumn | InsertProxyModel::InsertRow)));
    QCOMPARE(proxyModel.property("insertDirection").value<InsertProxyModel::InsertDirections>(),
             InsertProxyModel::InsertColumn | InsertProxyModel::InsertRow);
    QVERIFY(proxyModel.setProperty("mergeDisplayEdit", false));
    QCOMPARE(proxyModel.property("mergeDisplayEdit").toBool(), false);
}